

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo1344.c
# Opt level: O1

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct,uint8_t *ss,uint8_t *pk)

{
  uint uVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint32_t i0_2;
  uint16_t *puVar8;
  uint32_t i1;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  short *psVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint16_t sample0_2;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint16_t res_1;
  short *psVar22;
  ulong uVar23;
  uint16_t res;
  uint16_t uVar24;
  uint8_t *puVar25;
  uint32_t i0;
  long lVar26;
  uint16_t *input;
  uint32_t i0_1;
  uint16_t *__s;
  uint16_t a_matrix [1806336];
  uint8_t r [43136];
  uint16_t sp_matrix [10752];
  uint16_t ep_matrix [10752];
  uint16_t bp_matrix [10752];
  uint16_t b_matrix [10752];
  uint8_t pkh_mu [64];
  uint8_t shake_input_seed_se [33];
  uint8_t auStack_248 [8];
  uint8_t seed_se_k [64];
  uint8_t coins [32];
  uint16_t mu_encode [64];
  uint16_t epp_matrix [64];
  uint16_t v_matrix [64];
  undefined1 *local_38;
  
  coins[8] = '\0';
  coins[9] = '\0';
  coins[10] = '\0';
  coins[0xb] = '\0';
  coins[0xc] = '\0';
  coins[0xd] = '\0';
  coins[0xe] = '\0';
  coins[0xf] = '\0';
  coins[0x10] = '\0';
  coins[0x11] = '\0';
  coins[0x12] = '\0';
  coins[0x13] = '\0';
  coins[0x14] = '\0';
  coins[0x15] = '\0';
  coins[0x16] = '\0';
  coins[0x17] = '\0';
  seed_se_k[0x38] = '\0';
  seed_se_k[0x39] = '\0';
  seed_se_k[0x3a] = '\0';
  seed_se_k[0x3b] = '\0';
  seed_se_k[0x3c] = '\0';
  seed_se_k[0x3d] = '\0';
  seed_se_k[0x3e] = '\0';
  seed_se_k[0x3f] = '\0';
  coins[0] = '\0';
  coins[1] = '\0';
  coins[2] = '\0';
  coins[3] = '\0';
  coins[4] = '\0';
  coins[5] = '\0';
  coins[6] = '\0';
  coins[7] = '\0';
  randombytes_(0x20,seed_se_k + 0x38);
  seed_se_k[0x28] = '\0';
  seed_se_k[0x29] = '\0';
  seed_se_k[0x2a] = '\0';
  seed_se_k[0x2b] = '\0';
  seed_se_k[0x2c] = '\0';
  seed_se_k[0x2d] = '\0';
  seed_se_k[0x2e] = '\0';
  seed_se_k[0x2f] = '\0';
  seed_se_k[0x30] = '\0';
  seed_se_k[0x31] = '\0';
  seed_se_k[0x32] = '\0';
  seed_se_k[0x33] = '\0';
  seed_se_k[0x34] = '\0';
  seed_se_k[0x35] = '\0';
  seed_se_k[0x36] = '\0';
  seed_se_k[0x37] = '\0';
  seed_se_k[0x18] = '\0';
  seed_se_k[0x19] = '\0';
  seed_se_k[0x1a] = '\0';
  seed_se_k[0x1b] = '\0';
  seed_se_k[0x1c] = '\0';
  seed_se_k[0x1d] = '\0';
  seed_se_k[0x1e] = '\0';
  seed_se_k[0x1f] = '\0';
  seed_se_k[0x20] = '\0';
  seed_se_k[0x21] = '\0';
  seed_se_k[0x22] = '\0';
  seed_se_k[0x23] = '\0';
  seed_se_k[0x24] = '\0';
  seed_se_k[0x25] = '\0';
  seed_se_k[0x26] = '\0';
  seed_se_k[0x27] = '\0';
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  auStack_248[0] = '\0';
  auStack_248[1] = '\0';
  auStack_248[2] = '\0';
  auStack_248[3] = '\0';
  auStack_248[4] = '\0';
  auStack_248[5] = '\0';
  auStack_248[6] = '\0';
  auStack_248[7] = '\0';
  seed_se_k[0] = '\0';
  seed_se_k[1] = '\0';
  seed_se_k[2] = '\0';
  seed_se_k[3] = '\0';
  seed_se_k[4] = '\0';
  seed_se_k[5] = '\0';
  seed_se_k[6] = '\0';
  seed_se_k[7] = '\0';
  pkh_mu[0x28] = '\0';
  pkh_mu[0x29] = '\0';
  pkh_mu[0x2a] = '\0';
  pkh_mu[0x2b] = '\0';
  pkh_mu[0x2c] = '\0';
  pkh_mu[0x2d] = '\0';
  pkh_mu[0x2e] = '\0';
  pkh_mu[0x2f] = '\0';
  pkh_mu[0x30] = '\0';
  pkh_mu[0x31] = '\0';
  pkh_mu[0x32] = '\0';
  pkh_mu[0x33] = '\0';
  pkh_mu[0x34] = '\0';
  pkh_mu[0x35] = '\0';
  pkh_mu[0x36] = '\0';
  pkh_mu[0x37] = '\0';
  pkh_mu[0x18] = '\0';
  pkh_mu[0x19] = '\0';
  pkh_mu[0x1a] = '\0';
  pkh_mu[0x1b] = '\0';
  pkh_mu[0x1c] = '\0';
  pkh_mu[0x1d] = '\0';
  pkh_mu[0x1e] = '\0';
  pkh_mu[0x1f] = '\0';
  pkh_mu[0x20] = '\0';
  pkh_mu[0x21] = '\0';
  pkh_mu[0x22] = '\0';
  pkh_mu[0x23] = '\0';
  pkh_mu[0x24] = '\0';
  pkh_mu[0x25] = '\0';
  pkh_mu[0x26] = '\0';
  pkh_mu[0x27] = '\0';
  pkh_mu[8] = '\0';
  pkh_mu[9] = '\0';
  pkh_mu[10] = '\0';
  pkh_mu[0xb] = '\0';
  pkh_mu[0xc] = '\0';
  pkh_mu[0xd] = '\0';
  pkh_mu[0xe] = '\0';
  pkh_mu[0xf] = '\0';
  pkh_mu[0x10] = '\0';
  pkh_mu[0x11] = '\0';
  pkh_mu[0x12] = '\0';
  pkh_mu[0x13] = '\0';
  pkh_mu[0x14] = '\0';
  pkh_mu[0x15] = '\0';
  pkh_mu[0x16] = '\0';
  pkh_mu[0x17] = '\0';
  b_matrix[0x29fc] = 0;
  b_matrix[0x29fd] = 0;
  b_matrix[0x29fe] = 0;
  b_matrix[0x29ff] = 0;
  pkh_mu[0] = '\0';
  pkh_mu[1] = '\0';
  pkh_mu[2] = '\0';
  pkh_mu[3] = '\0';
  pkh_mu[4] = '\0';
  pkh_mu[5] = '\0';
  pkh_mu[6] = '\0';
  pkh_mu[7] = '\0';
  Hacl_Hash_SHA3_shake256((uint8_t *)(b_matrix + 0x29fc),0x20,pk,0x5410);
  pkh_mu[0x28] = coins[8];
  pkh_mu[0x29] = coins[9];
  pkh_mu[0x2a] = coins[10];
  pkh_mu[0x2b] = coins[0xb];
  pkh_mu[0x2c] = coins[0xc];
  pkh_mu[0x2d] = coins[0xd];
  pkh_mu[0x2e] = coins[0xe];
  pkh_mu[0x2f] = coins[0xf];
  pkh_mu[0x30] = coins[0x10];
  pkh_mu[0x31] = coins[0x11];
  pkh_mu[0x32] = coins[0x12];
  pkh_mu[0x33] = coins[0x13];
  pkh_mu[0x34] = coins[0x14];
  pkh_mu[0x35] = coins[0x15];
  pkh_mu[0x36] = coins[0x16];
  pkh_mu[0x37] = coins[0x17];
  pkh_mu[0x18] = seed_se_k[0x38];
  pkh_mu[0x19] = seed_se_k[0x39];
  pkh_mu[0x1a] = seed_se_k[0x3a];
  pkh_mu[0x1b] = seed_se_k[0x3b];
  pkh_mu[0x1c] = seed_se_k[0x3c];
  pkh_mu[0x1d] = seed_se_k[0x3d];
  pkh_mu[0x1e] = seed_se_k[0x3e];
  pkh_mu[0x1f] = seed_se_k[0x3f];
  pkh_mu[0x20] = coins[0];
  pkh_mu[0x21] = coins[1];
  pkh_mu[0x22] = coins[2];
  pkh_mu[0x23] = coins[3];
  pkh_mu[0x24] = coins[4];
  pkh_mu[0x25] = coins[5];
  pkh_mu[0x26] = coins[6];
  pkh_mu[0x27] = coins[7];
  Hacl_Hash_SHA3_shake256(auStack_248,0x40,(uint8_t *)(b_matrix + 0x29fc),0x40);
  puVar25 = r + 0xa878;
  lVar26 = 0;
  memset(puVar25,0,0x5400);
  memset(sp_matrix + 0x29fc,0,0x5400);
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  mu_encode[0x3c] = 0;
  mu_encode[0x3d] = 0;
  mu_encode[0x3e] = 0;
  mu_encode[0x3f] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  memset(a_matrix + 0x1b8ffc,0,0xa880);
  pkh_mu[0x38] = 0x96;
  pkh_mu._57_7_ = auStack_248._0_7_;
  Hacl_Hash_SHA3_shake256((uint8_t *)(a_matrix + 0x1b8ffc),0xa880,pkh_mu + 0x38,0x21);
  Lib_Memzero0_memzero0(pkh_mu + 0x38,0x21);
  memset(puVar25,0,0x5400);
  do {
    lVar9 = 0;
    do {
      lVar20 = lVar9 + lVar26 * 0x540;
      lVar19 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar19) -
                            (uint)(a_matrix[lVar20 + 0x1b8ffc] >> 1) & 0xffff) >> 0xf);
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0xc);
      uVar12 = a_matrix[lVar20 + 0x1b8ffc] & 1;
      sp_matrix[lVar20 + -4] = ((ushort)iVar15 ^ -uVar12) + uVar12;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x540);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 8);
  puVar8 = sp_matrix + 0x29fc;
  lVar26 = 0;
  memset(puVar8,0,0x5400);
  do {
    lVar9 = 0;
    do {
      lVar20 = lVar9 + lVar26 * 0x540;
      lVar19 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar19) -
                            (uint)(sp_matrix[lVar20 + -0x2a44] >> 1) & 0xffff) >> 0xf);
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0xc);
      uVar12 = sp_matrix[lVar20 + -0x2a44] & 1;
      sp_matrix[lVar20 + 0x29fc] = ((ushort)iVar15 ^ -uVar12) + uVar12;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x540);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 8);
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  mu_encode[0x3c] = 0;
  mu_encode[0x3d] = 0;
  mu_encode[0x3e] = 0;
  mu_encode[0x3f] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  lVar26 = 0;
  do {
    lVar9 = 0;
    do {
      lVar20 = lVar9 + lVar26 * 8;
      lVar19 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table1344 + lVar19) -
                            (uint)(sp_matrix[lVar20 + -0x44] >> 1) & 0xffff) >> 0xf);
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0xc);
      uVar12 = sp_matrix[lVar20 + -0x44] & 1;
      mu_encode[lVar20 + 0x3c] = ((ushort)iVar15 ^ -uVar12) + uVar12;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 8);
  __s = ep_matrix + 0x29fc;
  memset(__s,0,0x5400);
  local_38 = &stack0xffffffffffc6e4c8;
  memset(local_38,0,0x372000);
  memset(bp_matrix + 0x29fc,0,0x2a00);
  v_matrix[0x17] = 0;
  v_matrix[0xe] = 0;
  v_matrix[5] = 0;
  epp_matrix[0x3c] = 0;
  epp_matrix._122_6_ = (undefined6)*(undefined8 *)pk;
  v_matrix[0] = (uint16_t)((ulong)*(undefined8 *)pk >> 0x30);
  v_matrix._2_6_ = (undefined6)*(undefined8 *)(pk + 8);
  v_matrix[4] = (uint16_t)((ulong)*(undefined8 *)(pk + 8) >> 0x30);
  v_matrix._12_4_ = (undefined4)*(undefined8 *)pk;
  v_matrix._16_4_ = (undefined4)((ulong)*(undefined8 *)pk >> 0x20);
  v_matrix._20_4_ = (undefined4)*(undefined8 *)(pk + 8);
  v_matrix._24_4_ = (undefined4)((ulong)*(undefined8 *)(pk + 8) >> 0x20);
  v_matrix[0xf] = (uint16_t)*(undefined8 *)pk;
  v_matrix._32_6_ = (undefined6)((ulong)*(undefined8 *)pk >> 0x10);
  v_matrix[0x13] = (uint16_t)*(undefined8 *)(pk + 8);
  v_matrix._40_6_ = (undefined6)((ulong)*(undefined8 *)(pk + 8) >> 0x10);
  v_matrix._48_8_ = *(undefined8 *)pk;
  v_matrix._56_8_ = *(undefined8 *)(pk + 8);
  memset(local_38,0,0x372000);
  lVar26 = -0x540;
  input = epp_matrix + 0x3c;
  do {
    v_matrix._120_8_ = local_38 + 0x1f80;
    sVar2 = (short)lVar26;
    epp_matrix[0x3c] = sVar2 + 0x540;
    v_matrix[5] = sVar2 + 0x541;
    v_matrix[0xe] = sVar2 + 0x542;
    v_matrix[0x17] = sVar2 + 0x543;
    Hacl_Hash_SHA3_shake128((uint8_t *)(bp_matrix + 0x29fc),0xa80,(uint8_t *)input,0x12);
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0x53c),0xa80,(uint8_t *)(v_matrix + 5),0x12);
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0xa7c),0xa80,(uint8_t *)(v_matrix + 0xe),0x12);
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0xfbc),0xa80,(uint8_t *)(v_matrix + 0x17),0x12);
    memcpy(local_38,bp_matrix + 0x29fc,0xa80);
    memcpy(local_38 + 0xa80,b_matrix + 0x53c,0xa80);
    memcpy(local_38 + 0x1500,b_matrix + 0xa7c,0xa80);
    memcpy((void *)v_matrix._120_8_,b_matrix + 0xfbc,0xa80);
    local_38 = local_38 + 0x2a00;
    lVar26 = lVar26 + 4;
  } while (lVar26 != 0);
  lVar26 = 0;
  do {
    lVar9 = 0;
    psVar13 = (short *)&stack0xffffffffffc6e4c8;
    do {
      lVar20 = 0;
      uVar24 = 0;
      psVar22 = psVar13;
      do {
        uVar24 = uVar24 + *psVar22 * *(short *)(puVar25 + lVar20 * 2);
        lVar20 = lVar20 + 1;
        psVar22 = psVar22 + 0x540;
      } while (lVar20 != 0x540);
      bp_matrix[lVar26 * 0x540 + lVar9 + -4] = uVar24;
      lVar9 = lVar9 + 1;
      psVar13 = psVar13 + 1;
    } while (lVar9 != 0x540);
    lVar26 = lVar26 + 1;
    puVar25 = puVar25 + 0xa80;
  } while (lVar26 != 8);
  lVar26 = 0;
  do {
    lVar9 = 0;
    do {
      __s[lVar9] = __s[lVar9] + puVar8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x540);
    lVar26 = lVar26 + 1;
    puVar8 = puVar8 + 0x540;
    __s = __s + 0x540;
  } while (lVar26 != 8);
  lVar26 = 0;
  do {
    uVar21 = (ulong)*(ushort *)((long)ep_matrix + lVar26 + 0x53fe);
    uVar11 = (ulong)*(ushort *)((long)bp_matrix + lVar26 + 6);
    uVar23 = (ulong)*(uint *)((long)ep_matrix + lVar26 + 0x53f8) << 0x30;
    uVar16 = (ulong)*(ushort *)((long)ep_matrix + lVar26 + 0x53fa) << 0x20;
    uVar10 = (ulong)(uint)(*(int *)((long)ep_matrix + lVar26 + 0x53fc) << 0x10);
    uVar17 = (ulong)*(uint *)((long)bp_matrix + lVar26) << 0x30;
    uVar14 = (ulong)*(ushort *)((long)bp_matrix + lVar26 + 2) << 0x20;
    uVar18 = (ulong)(uint)(*(int *)((long)bp_matrix + lVar26 + 4) << 0x10);
    *(ulong *)(ct + lVar26) =
         uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
         (uVar16 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
    *(ulong *)(ct + lVar26 + 8) =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar14 & 0xff0000000000) >> 0x18 |
         (uVar14 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x5400);
  v_matrix[0x34] = 0;
  v_matrix[0x35] = 0;
  v_matrix[0x36] = 0;
  v_matrix[0x37] = 0;
  v_matrix[0x38] = 0;
  v_matrix[0x39] = 0;
  v_matrix[0x3a] = 0;
  v_matrix[0x3b] = 0;
  v_matrix[0x2c] = 0;
  v_matrix[0x2d] = 0;
  v_matrix[0x2e] = 0;
  v_matrix[0x2f] = 0;
  v_matrix[0x30] = 0;
  v_matrix[0x31] = 0;
  v_matrix[0x32] = 0;
  v_matrix[0x33] = 0;
  v_matrix[0x24] = 0;
  v_matrix[0x25] = 0;
  v_matrix[0x26] = 0;
  v_matrix[0x27] = 0;
  v_matrix[0x28] = 0;
  v_matrix[0x29] = 0;
  v_matrix[0x2a] = 0;
  v_matrix[0x2b] = 0;
  v_matrix[0x1c] = 0;
  v_matrix[0x1d] = 0;
  v_matrix[0x1e] = 0;
  v_matrix[0x1f] = 0;
  v_matrix[0x20] = 0;
  v_matrix[0x21] = 0;
  v_matrix[0x22] = 0;
  v_matrix[0x23] = 0;
  v_matrix[0x14] = 0;
  v_matrix[0x15] = 0;
  v_matrix[0x16] = 0;
  v_matrix[0x17] = 0;
  v_matrix[0x18] = 0;
  v_matrix[0x19] = 0;
  v_matrix[0x1a] = 0;
  v_matrix[0x1b] = 0;
  v_matrix[0xc] = 0;
  v_matrix[0xd] = 0;
  v_matrix[0xe] = 0;
  v_matrix[0xf] = 0;
  v_matrix[0x10] = 0;
  v_matrix[0x11] = 0;
  v_matrix[0x12] = 0;
  v_matrix[0x13] = 0;
  v_matrix[4] = 0;
  v_matrix[5] = 0;
  v_matrix[6] = 0;
  v_matrix[7] = 0;
  v_matrix[8] = 0;
  v_matrix[9] = 0;
  v_matrix[10] = 0;
  v_matrix[0xb] = 0;
  epp_matrix[0x3c] = 0;
  epp_matrix[0x3d] = 0;
  epp_matrix[0x3e] = 0;
  epp_matrix[0x3f] = 0;
  v_matrix[0] = 0;
  v_matrix[1] = 0;
  v_matrix[2] = 0;
  v_matrix[3] = 0;
  lVar26 = 0;
  memset(bp_matrix + 0x29fc,0,0x5400);
  do {
    lVar9 = *(long *)(pk + lVar26 + 0x10);
    lVar20 = *(long *)(pk + lVar26 + 0x18);
    uVar6 = (ushort)((ulong)lVar9 >> 0x28);
    uVar4 = (ushort)((ulong)lVar9 >> 0x18);
    uVar12 = (ushort)((ulong)lVar9 >> 8);
    uVar7 = (ushort)((ulong)lVar20 >> 0x28);
    uVar5 = (ushort)((ulong)lVar20 >> 0x18);
    uVar3 = (ushort)((ulong)lVar20 >> 8);
    *(ushort *)((long)bp_matrix + lVar26 + 0x53f8) =
         uVar12 & 0xff | (ushort)((ulong)(lVar9 << 0x38) >> 0x30);
    *(ushort *)((long)bp_matrix + lVar26 + 0x53fa) = uVar4 & 0xff | uVar12 & 0xff00;
    *(ushort *)((long)bp_matrix + lVar26 + 0x53fc) = uVar6 & 0xff | uVar4 & 0xff00;
    *(ushort *)((long)bp_matrix + lVar26 + 0x53fe) =
         (ushort)(byte)((ulong)lVar9 >> 0x38) | uVar6 & 0xff00;
    *(ushort *)((long)b_matrix + lVar26) = uVar3 & 0xff | (ushort)((ulong)(lVar20 << 0x38) >> 0x30);
    *(ushort *)((long)b_matrix + lVar26 + 2) = uVar5 & 0xff | uVar3 & 0xff00;
    *(ushort *)((long)b_matrix + lVar26 + 4) = uVar7 & 0xff | uVar5 & 0xff00;
    *(ushort *)((long)b_matrix + lVar26 + 6) =
         (ushort)(byte)((ulong)lVar20 >> 0x38) | uVar7 & 0xff00;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x5400);
  puVar25 = r + 0xa878;
  lVar26 = 0;
  do {
    lVar9 = 0;
    puVar8 = bp_matrix + 0x29fc;
    do {
      lVar20 = 0;
      uVar24 = 0;
      do {
        uVar24 = uVar24 + puVar8[lVar20 * 4] * *(short *)(puVar25 + lVar20);
        lVar20 = lVar20 + 2;
      } while (lVar20 != 0xa80);
      v_matrix[lVar26 * 8 + lVar9 + -4] = uVar24;
      lVar9 = lVar9 + 1;
      puVar8 = puVar8 + 1;
    } while (lVar9 != 8);
    lVar26 = lVar26 + 1;
    puVar25 = puVar25 + 0xa80;
  } while (lVar26 != 8);
  puVar8 = mu_encode + 0x3c;
  lVar26 = 0;
  do {
    lVar9 = 0;
    do {
      input[lVar9] = input[lVar9] + puVar8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    lVar26 = lVar26 + 1;
    puVar8 = puVar8 + 8;
    input = input + 8;
  } while (lVar26 != 8);
  mu_encode[0x34] = 0;
  mu_encode[0x35] = 0;
  mu_encode[0x36] = 0;
  mu_encode[0x37] = 0;
  mu_encode[0x38] = 0;
  mu_encode[0x39] = 0;
  mu_encode[0x3a] = 0;
  mu_encode[0x3b] = 0;
  mu_encode[0x2c] = 0;
  mu_encode[0x2d] = 0;
  mu_encode[0x2e] = 0;
  mu_encode[0x2f] = 0;
  mu_encode[0x30] = 0;
  mu_encode[0x31] = 0;
  mu_encode[0x32] = 0;
  mu_encode[0x33] = 0;
  mu_encode[0x24] = 0;
  mu_encode[0x25] = 0;
  mu_encode[0x26] = 0;
  mu_encode[0x27] = 0;
  mu_encode[0x28] = 0;
  mu_encode[0x29] = 0;
  mu_encode[0x2a] = 0;
  mu_encode[0x2b] = 0;
  mu_encode[0x1c] = 0;
  mu_encode[0x1d] = 0;
  mu_encode[0x1e] = 0;
  mu_encode[0x1f] = 0;
  mu_encode[0x20] = 0;
  mu_encode[0x21] = 0;
  mu_encode[0x22] = 0;
  mu_encode[0x23] = 0;
  mu_encode[0x14] = 0;
  mu_encode[0x15] = 0;
  mu_encode[0x16] = 0;
  mu_encode[0x17] = 0;
  mu_encode[0x18] = 0;
  mu_encode[0x19] = 0;
  mu_encode[0x1a] = 0;
  mu_encode[0x1b] = 0;
  mu_encode[0xc] = 0;
  mu_encode[0xd] = 0;
  mu_encode[0xe] = 0;
  mu_encode[0xf] = 0;
  mu_encode[0x10] = 0;
  mu_encode[0x11] = 0;
  mu_encode[0x12] = 0;
  mu_encode[0x13] = 0;
  mu_encode[4] = 0;
  mu_encode[5] = 0;
  mu_encode[6] = 0;
  mu_encode[7] = 0;
  mu_encode[8] = 0;
  mu_encode[9] = 0;
  mu_encode[10] = 0;
  mu_encode[0xb] = 0;
  coins[0x18] = '\0';
  coins[0x19] = '\0';
  coins[0x1a] = '\0';
  coins[0x1b] = '\0';
  coins[0x1c] = '\0';
  coins[0x1d] = '\0';
  coins[0x1e] = '\0';
  coins[0x1f] = '\0';
  mu_encode[0] = 0;
  mu_encode[1] = 0;
  mu_encode[2] = 0;
  mu_encode[3] = 0;
  lVar26 = 0;
  do {
    uVar1 = *(uint *)(seed_se_k + lVar26 + 0x38);
    mu_encode[lVar26 * 2 + -4] = (uint16_t)(uVar1 << 0xc);
    mu_encode[lVar26 * 2 + -3] = (ushort)(uVar1 << 8) & 0xf000;
    mu_encode[lVar26 * 2 + -2] = (ushort)(uVar1 << 4) & 0xf000;
    mu_encode[lVar26 * 2 + -1] = (ushort)uVar1 & 0xf000;
    mu_encode[lVar26 * 2] = (ushort)(uVar1 >> 4) & 0xf000;
    mu_encode[lVar26 * 2 + 1] = (ushort)(uVar1 >> 8) & 0xf000;
    mu_encode[lVar26 * 2 + 2] = (ushort)(uVar1 >> 0xc) & 0xf000;
    mu_encode[lVar26 * 2 + 3] = (ushort)(uVar1 >> 0x10) & 0xf000;
    lVar26 = lVar26 + 4;
  } while (lVar26 != 0x20);
  puVar25 = coins + 0x18;
  puVar8 = epp_matrix + 0x3c;
  lVar26 = 0;
  do {
    lVar9 = 0;
    do {
      puVar8[lVar9] = puVar8[lVar9] + *(short *)(puVar25 + lVar9 * 2);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    lVar26 = lVar26 + 1;
    puVar25 = puVar25 + 0x10;
    puVar8 = puVar8 + 8;
  } while (lVar26 != 8);
  Lib_Memzero0_memzero0(coins + 0x18,0x80);
  lVar26 = 0;
  do {
    uVar21 = (ulong)*(ushort *)((long)epp_matrix + lVar26 + 0x7e);
    uVar11 = (ulong)*(ushort *)((long)v_matrix + lVar26 + 6);
    uVar23 = (ulong)*(uint *)((long)epp_matrix + lVar26 + 0x78) << 0x30;
    uVar16 = (ulong)*(ushort *)((long)epp_matrix + lVar26 + 0x7a) << 0x20;
    uVar10 = (ulong)(uint)(*(int *)((long)epp_matrix + lVar26 + 0x7c) << 0x10);
    uVar17 = (ulong)*(uint *)((long)v_matrix + lVar26) << 0x30;
    uVar14 = (ulong)*(ushort *)((long)v_matrix + lVar26 + 2) << 0x20;
    uVar18 = (ulong)(uint)(*(int *)((long)v_matrix + lVar26 + 4) << 0x10);
    *(ulong *)(ct + lVar26 + 0x5400) =
         uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
         (uVar16 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
    *(ulong *)(ct + lVar26 + 0x5408) =
         uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 | (uVar14 & 0xff0000000000) >> 0x18 |
         (uVar14 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x80);
  Lib_Memzero0_memzero0(epp_matrix + 0x3c,0x80);
  Lib_Memzero0_memzero0(r + 0xa878,0x5400);
  Lib_Memzero0_memzero0(sp_matrix + 0x29fc,0x5400);
  Lib_Memzero0_memzero0(mu_encode + 0x3c,0x80);
  memcpy(&stack0xffffffffffc69028,ct,0x5480);
  Hacl_Hash_SHA3_shake256(ss,0x20,&stack0xffffffffffc69028,0x54a0);
  Lib_Memzero0_memzero0(&stack0xffffffffffc69028,0x54a0);
  Lib_Memzero0_memzero0(auStack_248,0x40);
  Lib_Memzero0_memzero0(seed_se_k + 0x38,0x20);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct, uint8_t *ss, uint8_t *pk)
{
  uint8_t coins[32U] = { 0U };
  randombytes_(32U, coins);
  uint8_t seed_se_k[64U] = { 0U };
  uint8_t pkh_mu[64U] = { 0U };
  Hacl_Hash_SHA3_shake256(pkh_mu, 32U, pk, 21520U);
  memcpy(pkh_mu + 32U, coins, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(seed_se_k, 64U, pkh_mu, 64U);
  uint8_t *seed_se = seed_se_k;
  uint8_t *k = seed_se_k + 32U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  uint16_t sp_matrix[10752U] = { 0U };
  uint16_t ep_matrix[10752U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[43136U] = { 0U };
  uint8_t shake_input_seed_se[33U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(r, 43136U, shake_input_seed_se, 33U);
  Lib_Memzero0_memzero(shake_input_seed_se, 33U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r + 21504U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 8U, r + 43008U, epp_matrix);
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 21504U;
  uint16_t bp_matrix[10752U] = { 0U };
  KRML_CHECK_SIZE(sizeof (uint16_t), 1806336U);
  uint16_t a_matrix[1806336U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 1344U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 1344U, sp_matrix, a_matrix, bp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 1344U, bp_matrix, ep_matrix);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 1344U, 16U, bp_matrix, c1);
  uint16_t v_matrix[64U] = { 0U };
  uint16_t b_matrix[10752U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(1344U, 8U, 16U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 8U, sp_matrix, b_matrix, v_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(16U, 4U, 8U, coins, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 8U, 16U, v_matrix, c2);
  Lib_Memzero0_memzero(v_matrix, 64U, uint16_t, void *);
  Lib_Memzero0_memzero(sp_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint32_t ss_init_len = 21664U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t shake_input_ss[ss_init_len];
  memset(shake_input_ss, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(shake_input_ss, ct, 21632U * sizeof (uint8_t));
  memcpy(shake_input_ss + 21632U, k, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(ss, 32U, shake_input_ss, ss_init_len);
  Lib_Memzero0_memzero(shake_input_ss, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 64U, uint8_t, void *);
  Lib_Memzero0_memzero(coins, 32U, uint8_t, void *);
  return 0U;
}